

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O1

UChar32 * u_strToUTF32WithSub_63
                    (UChar32 *dest,int32_t destCapacity,int32_t *pDestLength,UChar *src,
                    int32_t srcLength,UChar32 subchar,int32_t *pNumSubstitutions,
                    UErrorCode *pErrorCode)

{
  UChar UVar1;
  UChar *pUVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  uint *puVar6;
  UChar *pUVar7;
  uint uVar8;
  bool bVar9;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((((-1 < destCapacity) && (-2 < srcLength)) && (src != (UChar *)0x0 || srcLength == 0)) &&
       ((subchar < 0x110000 && (destCapacity < 1 || dest != (UChar32 *)0x0)) &&
        (subchar & 0xfffff800U) != 0xd800)) {
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = 0;
      }
      puVar6 = (uint *)(dest + (uint)destCapacity);
      if (dest == (UChar32 *)0x0) {
        puVar6 = (uint *)0x0;
      }
      puVar5 = (uint *)dest;
      if (srcLength < 0) {
        UVar1 = *src;
        bVar9 = UVar1 != L'\0';
        iVar4 = 0;
        if ((UVar1 & 0xf800U) != 0xd800 && bVar9) {
          iVar4 = 0;
          do {
            if (puVar5 < puVar6) {
              *puVar5 = (uint)(ushort)UVar1;
              puVar5 = puVar5 + 1;
            }
            else {
              iVar4 = iVar4 + 1;
            }
            src = src + 1;
            UVar1 = *src;
            bVar9 = UVar1 != L'\0';
          } while ((bVar9) && ((UVar1 & 0xf800U) != 0xd800));
        }
        pUVar7 = src;
        if (bVar9) {
          do {
            pUVar2 = pUVar7 + 1;
            pUVar7 = pUVar7 + 1;
          } while (*pUVar2 != L'\0');
        }
      }
      else {
        pUVar7 = src + (uint)srcLength;
        if (src == (UChar *)0x0) {
          pUVar7 = src;
        }
        iVar4 = 0;
      }
      iVar3 = 0;
      if (src < pUVar7) {
        iVar3 = 0;
        do {
          pUVar2 = src + 1;
          uVar8 = (uint)(ushort)*src;
          if ((uVar8 & 0xf800) == 0xd800) {
            if ((pUVar2 < pUVar7 && ((ushort)*src >> 10 & 1) == 0) &&
               (UVar1 = *pUVar2, (UVar1 & 0xfc00U) == 0xdc00)) {
              pUVar2 = src + 2;
              uVar8 = uVar8 * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
            }
            else {
              if (subchar < 0) {
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return (UChar32 *)0x0;
              }
              iVar3 = iVar3 + 1;
              uVar8 = subchar;
            }
          }
          if (puVar5 < puVar6) {
            *puVar5 = uVar8;
            puVar5 = puVar5 + 1;
          }
          else {
            iVar4 = iVar4 + 1;
          }
          src = pUVar2;
        } while (pUVar2 < pUVar7);
      }
      iVar4 = (int)((ulong)((long)puVar5 - (long)dest) >> 2) + iVar4;
      if (pDestLength != (int32_t *)0x0) {
        *pDestLength = iVar4;
      }
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = iVar3;
      }
      u_terminateUChar32s_63(dest,destCapacity,iVar4,pErrorCode);
      return dest;
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (UChar32 *)0x0;
}

Assistant:

U_CAPI UChar32* U_EXPORT2 
u_strToUTF32WithSub(UChar32 *dest,
             int32_t destCapacity,
             int32_t *pDestLength,
             const UChar *src,
             int32_t srcLength,
             UChar32 subchar, int32_t *pNumSubstitutions,
             UErrorCode *pErrorCode) {
    const UChar *srcLimit;
    UChar32 ch;
    UChar ch2;
    UChar32 *destLimit;
    UChar32 *pDest;
    int32_t reqLength;
    int32_t numSubstitutions;

    /* args check */
    if(U_FAILURE(*pErrorCode)){
        return NULL;
    }
    if( (src==NULL && srcLength!=0) || srcLength < -1 ||
        (destCapacity<0) || (dest == NULL && destCapacity > 0) ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions != NULL) {
        *pNumSubstitutions = 0;
    }

    pDest = dest;
    destLimit = (dest!=NULL)?(dest + destCapacity):NULL;
    reqLength = 0;
    numSubstitutions = 0;

    if(srcLength < 0) {
        /* simple loop for conversion of a NUL-terminated BMP string */
        while((ch=*src) != 0 && !U16_IS_SURROGATE(ch)) {
            ++src;
            if(pDest < destLimit) {
                *pDest++ = ch;
            } else {
                ++reqLength;
            }
        }
        srcLimit = src;
        if(ch != 0) {
            /* "complicated" case, find the end of the remaining string */
            while(*++srcLimit != 0) {}
        }
    } else {
        srcLimit = (src!=NULL)?(src + srcLength):NULL;
    }

    /* convert with length */
    while(src < srcLimit) {
        ch = *src++;
        if(!U16_IS_SURROGATE(ch)) {
            /* write or count ch below */
        } else if(U16_IS_SURROGATE_LEAD(ch) && src < srcLimit && U16_IS_TRAIL(ch2 = *src)) {
            ++src;
            ch = U16_GET_SUPPLEMENTARY(ch, ch2);
        } else if((ch = subchar) < 0) {
            /* unpaired surrogate */
            *pErrorCode = U_INVALID_CHAR_FOUND;
            return NULL;
        } else {
            ++numSubstitutions;
        }
        if(pDest < destLimit) {
            *pDest++ = ch;
        } else {
            ++reqLength;
        }
    }

    reqLength += (int32_t)(pDest - dest);
    if(pDestLength) {
        *pDestLength = reqLength;
    }
    if(pNumSubstitutions != NULL) {
        *pNumSubstitutions = numSubstitutions;
    }

    /* Terminate the buffer */
    u_terminateUChar32s(dest, destCapacity, reqLength, pErrorCode);

    return dest;
}